

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVMDisassembler.c
# Opt level: O3

_Bool EVM_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,
                        uint64_t address,void *inst_info)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_detail *pcVar3;
  uint8_t uVar4;
  ulong uVar5;
  uint uVar6;
  
  if ((code_len == 0) || (bVar2 = *code, opcodes[bVar2] == -1)) {
    return false;
  }
  MI->address = address;
  MI->Opcode = (uint)bVar2;
  MI->OpcodePub = (uint)bVar2;
  if ((char)bVar2 < '`') {
    *size = 1;
  }
  else {
    if (code_len < bVar2 - 0x5e) {
      return false;
    }
    *size = (uint16_t)(bVar2 - 0x5e);
    memcpy(MI->evm_data,code + 1,(ulong)(bVar2 - 0x5f & 0xff));
  }
  pcVar3 = MI->flat_insn->detail;
  if (pcVar3 == (cs_detail *)0x0) {
    return true;
  }
  *(undefined8 *)(pcVar3->groups + 5) = 0;
  (pcVar3->field_6).m68k.operands[0].field_0.imm = 0;
  pcVar3->regs_write[0xf] = 0;
  pcVar3->regs_write[0x10] = 0;
  pcVar3->regs_write[0x11] = 0;
  pcVar3->regs_write[0x12] = 0;
  *(undefined8 *)(pcVar3->regs_write + 0x13) = 0;
  pcVar3->regs_write[7] = 0;
  pcVar3->regs_write[8] = 0;
  pcVar3->regs_write[9] = 0;
  pcVar3->regs_write[10] = 0;
  pcVar3->regs_write[0xb] = 0;
  pcVar3->regs_write[0xc] = 0;
  pcVar3->regs_write[0xd] = 0;
  pcVar3->regs_write[0xe] = 0;
  pcVar3->regs_read_count = '\0';
  pcVar3->field_0x21 = 0;
  pcVar3->regs_write[0] = 0;
  pcVar3->regs_write[1] = 0;
  pcVar3->regs_write[2] = 0;
  pcVar3->regs_write[3] = 0;
  pcVar3->regs_write[4] = 0;
  pcVar3->regs_write[5] = 0;
  pcVar3->regs_write[6] = 0;
  pcVar3->regs_read[8] = 0;
  pcVar3->regs_read[9] = 0;
  pcVar3->regs_read[10] = 0;
  pcVar3->regs_read[0xb] = 0;
  pcVar3->regs_read[0xc] = 0;
  pcVar3->regs_read[0xd] = 0;
  pcVar3->regs_read[0xe] = 0;
  pcVar3->regs_read[0xf] = 0;
  pcVar3->regs_read[0] = 0;
  pcVar3->regs_read[1] = 0;
  pcVar3->regs_read[2] = 0;
  pcVar3->regs_read[3] = 0;
  pcVar3->regs_read[4] = 0;
  pcVar3->regs_read[5] = 0;
  pcVar3->regs_read[6] = 0;
  pcVar3->regs_read[7] = 0;
  uVar6 = (uint)bVar2;
  EVM_get_insn_id((cs_struct *)ud,MI->flat_insn,(uint)bVar2);
  pcVar3 = MI->flat_insn->detail;
  if ((pcVar3->field_6).x86.prefix[0] != '\0') {
    pcVar3->groups[pcVar3->groups_count] = '\n';
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups_count = pcVar3->groups_count + '\x01';
  }
  if ((pcVar3->field_6).x86.prefix[1] != '\0') {
    pcVar3->groups[pcVar3->groups_count] = '\t';
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups_count = pcVar3->groups_count + '\x01';
  }
  if (uVar6 < 0x51) {
    if (0x3c < uVar6) {
      return true;
    }
    uVar4 = '\b';
    uVar5 = (ulong)uVar6;
    if ((0xffeUL >> (uVar5 & 0x3f) & 1) == 0) {
      if ((0x1280000000000000U >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 != 0) {
          return true;
        }
        goto LAB_00265f7b;
      }
switchD_00265f53_caseD_52:
      uVar4 = '\v';
    }
  }
  else if (uVar6 < 0xf0) {
    switch(uVar6) {
    case 0x51:
switchD_00265f53_caseD_51:
      uVar4 = '\f';
      break;
    case 0x52:
    case 0x53:
      goto switchD_00265f53_caseD_52;
    case 0x54:
      uVar4 = '\x0e';
      break;
    case 0x55:
      uVar4 = '\r';
      break;
    case 0x56:
    case 0x57:
      uVar4 = '\x01';
      break;
    default:
      goto switchD_00265f53_default;
    }
  }
  else {
    if ((bVar2 - 0xf0 < 5) || (uVar6 == 0xfd)) goto switchD_00265f53_caseD_51;
    if (uVar6 != 0xff) {
      return true;
    }
LAB_00265f7b:
    uVar4 = '\x0f';
  }
  pcVar3->groups[pcVar3->groups_count] = uVar4;
  puVar1 = &MI->flat_insn->detail->groups_count;
  *puVar1 = *puVar1 + '\x01';
switchD_00265f53_default:
  return true;
}

Assistant:

bool EVM_getInstruction(csh ud, const uint8_t *code, size_t code_len,
	MCInst *MI, uint16_t *size, uint64_t address, void *inst_info)
{
	unsigned char opcode;

	if (code_len == 0)
		return false;

	opcode = code[0];
	if (opcodes[opcode] == -1) {
		// invalid opcode
		return false;
	}

	// valid opcode
	MI->address = address;
	MI->OpcodePub = MI->Opcode = opcode;

	if (opcode >= EVM_INS_PUSH1 && opcode <= EVM_INS_PUSH32) {
		unsigned char len = (opcode - EVM_INS_PUSH1 + 1);
		if (code_len < 1 + len) {
			// not enough data
			return false;
		}

		*size = 1 + len;
		memcpy(MI->evm_data, code + 1, len);
	} else
		*size = 1;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, evm)+sizeof(cs_evm));
		EVM_get_insn_id((cs_struct *)ud, MI->flat_insn, opcode);

		if (MI->flat_insn->detail->evm.pop) {
			MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_STACK_READ;
			MI->flat_insn->detail->groups_count++;
		}

		if (MI->flat_insn->detail->evm.push) {
			MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_STACK_WRITE;
			MI->flat_insn->detail->groups_count++;
		}

		// setup groups
		switch(opcode) {
			default:
				break;
			case EVM_INS_ADD:
			case EVM_INS_MUL:
			case EVM_INS_SUB:
			case EVM_INS_DIV:
			case EVM_INS_SDIV:
			case EVM_INS_MOD:
			case EVM_INS_SMOD:
			case EVM_INS_ADDMOD:
			case EVM_INS_MULMOD:
			case EVM_INS_EXP:
			case EVM_INS_SIGNEXTEND:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_MATH;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_MSTORE:
			case EVM_INS_MSTORE8:
			case EVM_INS_CALLDATACOPY:
			case EVM_INS_CODECOPY:
			case EVM_INS_EXTCODECOPY:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_MEM_WRITE;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_MLOAD:
			case EVM_INS_CREATE:
			case EVM_INS_CALL:
			case EVM_INS_CALLCODE:
			case EVM_INS_RETURN:
			case EVM_INS_DELEGATECALL:
			case EVM_INS_REVERT:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_MEM_READ;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_SSTORE:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_STORE_WRITE;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_SLOAD:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_STORE_READ;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_JUMP:
			case EVM_INS_JUMPI:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_JUMP;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_STOP:
			case EVM_INS_SUICIDE:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_HALT;
				MI->flat_insn->detail->groups_count++;
				break;

		}
	}

	return true;
}